

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O0

int hostkey_method_ssh_ed25519_dtor(LIBSSH2_SESSION *session,void **abstract)

{
  EVP_PKEY *keyctx;
  void **abstract_local;
  LIBSSH2_SESSION *session_local;
  
  if ((EVP_PKEY *)*abstract != (EVP_PKEY *)0x0) {
    EVP_PKEY_free((EVP_PKEY *)*abstract);
  }
  *abstract = (void *)0x0;
  return 0;
}

Assistant:

static int
hostkey_method_ssh_ed25519_dtor(LIBSSH2_SESSION * session, void **abstract)
{
    libssh2_ed25519_ctx *keyctx = (libssh2_ed25519_ctx*) (*abstract);
    (void)session;

    if(keyctx)
        _libssh2_ed25519_free(keyctx);

    *abstract = NULL;

    return 0;
}